

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
std::_Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>::_Tuple_impl
          (_Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_> *this,
          _Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_> *param_2)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  VTable *pVVar3;
  
  (this->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031e3f8;
  pVVar1 = (param_2->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
           super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
           super_MatcherBase<unsigned_int>.vtable_;
  (this->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.vtable_ = pVVar1;
  (this->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.buffer_ =
       (param_2->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
       super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
       super_MatcherBase<unsigned_int>.buffer_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
             super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
             super_MatcherBase<unsigned_int>.buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>).
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031e450;
  (this->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a478;
  pVVar3 = (param_2->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.
           super_MatcherBase<int>.vtable_;
  (this->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  vtable_ = pVVar3;
  (this->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  buffer_ = (param_2->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.
            super_MatcherBase<int>.buffer_;
  if ((pVVar3 != (VTable *)0x0) &&
     (pVVar3->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.
             super_MatcherBase<int>.buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Head_base<1UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a558;
  return;
}

Assistant:

MatcherBase(const MatcherBase& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    if (IsShared()) buffer_.shared->Ref();
  }